

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O0

void __thiscall cppforth::Forth::fileStatus(Forth *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  path local_78;
  byte local_4d;
  bool exists;
  undefined1 local_40 [8];
  string filename;
  size_t length;
  uint caddr;
  Forth *this_local;
  
  requireDStackDepth(this,2,"OPEN-FILE");
  uVar2 = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
  filename.field_2._8_8_ = ZEXT48(uVar3);
  std::__cxx11::string::string((string *)local_40);
  moveFromDataSpace(this,(string *)local_40,uVar2,filename.field_2._8_8_);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
             ,auto_format);
  bVar1 = std::filesystem::exists(&local_78);
  std::filesystem::__cxx11::path::~path(&local_78);
  local_4d = bVar1;
  ForthStack<unsigned_int>::setTop(&this->dStack,1,0);
  uVar2 = 0xffffffbd;
  if ((local_4d & 1) != 0) {
    uVar2 = 0;
  }
  ForthStack<unsigned_int>::setTop(&this->dStack,uVar2);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void fileStatus() {
	REQUIRE_DSTACK_DEPTH(2, "OPEN-FILE");

	auto caddr = dStack.getTop(1);
	auto length = SIZE_T(dStack.getTop());
	
	std::string filename{};
	moveFromDataSpace(filename, caddr, length);
	auto exists = std::filesystem::exists(filename);
	dStack.setTop(1, 0);
	dStack.setTop(exists? 0: errorFileStatus );
}